

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O0

bool __thiscall helics::MultiBroker::brokerConnect(MultiBroker *this)

{
  milliseconds timeOut;
  milliseconds timeOut_00;
  string_view name;
  string_view name_00;
  bool bVar1;
  CoreType CVar2;
  uint uVar3;
  element_type *peVar4;
  pointer pCVar5;
  ConfigBase *this_00;
  socklen_t sVar6;
  int __c;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar7;
  CoreBroker *in_RDI;
  ostringstream oss;
  Error *e;
  bool res;
  unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> comm;
  uint16_t index;
  bool moreComms;
  string localConfigString;
  shared_ptr<helics::helicsCLI11App> app;
  undefined1 in_stack_00000e97;
  NetworkBrokerData *in_stack_00000e98;
  string_view in_stack_00000ea0;
  CommsInterface *in_stack_fffffffffffff848;
  undefined7 in_stack_fffffffffffff850;
  char in_stack_fffffffffffff857;
  undefined4 in_stack_fffffffffffff858;
  CoreType in_stack_fffffffffffff85c;
  CommsInterface *in_stack_fffffffffffff860;
  milliseconds in_stack_fffffffffffff880;
  pointer in_stack_fffffffffffff888;
  string *in_stack_fffffffffffff890;
  char *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  App *in_stack_fffffffffffff8b8;
  App *in_stack_fffffffffffff8c0;
  undefined8 in_stack_fffffffffffffa28;
  undefined1 includeEnvironmentVariable;
  helicsCLI11App *this_01;
  undefined1 in_stack_fffffffffffffad7;
  string *in_stack_fffffffffffffad8;
  App *in_stack_fffffffffffffae0;
  allocator<char> local_349 [49];
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  short local_224;
  allocator<char> local_221 [40];
  allocator<char> local_1f9 [40];
  allocator<char> local_1d1 [40];
  allocator<char> local_1a9 [40];
  allocator<char> local_181 [40];
  byte local_159;
  __sv_type local_158;
  uint local_144;
  rep local_140;
  allocator<char> local_c1 [65];
  undefined1 local_1;
  
  includeEnvironmentVariable = (undefined1)((ulong)in_stack_fffffffffffffa28 >> 0x38);
  CLI::std::shared_ptr<helics::helicsCLI11App>::shared_ptr
            ((shared_ptr<helics::helicsCLI11App> *)0x1f26ac);
  std::operator+(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                 in_stack_fffffffffffff857);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f270e);
  if (bVar1) {
    if (*(int *)((long)&in_RDI[1].super_BrokerBase.actionQueue.m_pullLock.super___mutex_base.
                        _M_mutex + 0x1c) == 0x2d) {
      *(undefined4 *)
       ((long)&in_RDI[1].super_BrokerBase.actionQueue.m_pullLock.super___mutex_base._M_mutex + 0x1c)
           = 0;
    }
  }
  else {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff860,
               (char *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    NetworkBrokerData::commandLineParser
              (in_stack_00000e98,in_stack_00000ea0,(bool)in_stack_00000e97);
    this_01 = (helicsCLI11App *)&stack0xffffffffffffff80;
    CLI::std::shared_ptr<helics::helicsCLI11App>::operator=
              ((shared_ptr<helics::helicsCLI11App> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (shared_ptr<helics::helicsCLI11App> *)in_stack_fffffffffffff848);
    CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
              ((shared_ptr<helics::helicsCLI11App> *)0x1f279f);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f27ac);
    helicsCLI11App::addTypeOption(this_01,(bool)includeEnvironmentVariable);
    peVar4 = CLI::std::
             __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f27c8);
    CLI::App::allow_config_extras(&peVar4->super_App,error);
  }
  if (*(int *)((long)&in_RDI[1].super_BrokerBase.actionQueue.m_pullLock.super___mutex_base._M_mutex
              + 0x1c) == 0x2d) {
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f2875);
    CLI::App::get_config_formatter_base((App *)in_stack_fffffffffffff848);
    CLI::std::__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f2894);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
               (allocator<char> *)in_stack_fffffffffffff880.__r);
    CLI::ConfigBase::section
              ((ConfigBase *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (string *)in_stack_fffffffffffff848);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    std::allocator<char>::~allocator(local_c1);
    CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x1f290d);
    peVar4 = CLI::std::
             __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f291a);
    helicsCLI11App::setDefaultCoreType
              (peVar4,*(CoreType *)
                       ((long)&in_RDI[1].super_BrokerBase.actionQueue.m_pullLock.super___mutex_base.
                               _M_mutex + 0x1c));
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f293f);
    std::__cxx11::string::string
              (in_stack_fffffffffffff890,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff888);
    CLI::App::parse(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                    (bool)in_stack_fffffffffffffad7);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    peVar4 = CLI::std::
             __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f2991);
    CVar2 = helicsCLI11App::getCoreType(peVar4);
    *(CoreType *)
     ((long)&in_RDI[1].super_BrokerBase.actionQueue.m_pullLock.super___mutex_base._M_mutex + 0x1c) =
         CVar2;
  }
  if (*(int *)((long)&in_RDI[1].super_BrokerBase.actionQueue.m_pullLock.super___mutex_base._M_mutex
              + 0x1c) != 0x2d) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f2a7a);
    if ((bVar1) &&
       (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1f2a98), bVar1)) {
      CoreBroker::setAsRoot
                ((CoreBroker *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    }
    CommFactory::create(in_stack_fffffffffffff85c);
    CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
    operator=((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *)
              CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
              (unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *)
              in_stack_fffffffffffff848);
    CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
    ~unique_ptr((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *)
                CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    pCVar5 = CLI::std::
             unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
             operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                         *)0x1f2b12);
    sVar6 = (socklen_t)pCVar5;
    std::function<void(helics::ActionMessage&&)>::
    function<helics::MultiBroker::brokerConnect()::__0,void>
              ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffff860,
               (anon_class_8_1_8991fb9c *)
               CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    CommsInterface::setCallback
              (in_stack_fffffffffffff860,
               (function<void_(helics::ActionMessage_&&)> *)
               CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    CLI::std::function<void_(helics::ActionMessage_&&)>::~function
              ((function<void_(helics::ActionMessage_&&)> *)0x1f2b6e);
    CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
    operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *)
               0x1f2b82);
    BrokerBase::getLoggingCallback
              ((BrokerBase *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    CommsInterface::setLoggingCallback
              (in_stack_fffffffffffff860,
               (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    CLI::std::
    function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)0x1f2bc9);
    CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
    operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *)
               0x1f2bdd);
    CoreBroker::getIdentifier_abi_cxx11_(in_RDI);
    CommsInterface::setName
              ((CommsInterface *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (string *)in_stack_fffffffffffff848);
    pCVar5 = CLI::std::
             unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
             operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                         *)0x1f2c27);
    (*pCVar5->_vptr_CommsInterface[2])(pCVar5,&in_RDI[1].super_BrokerBase.maxFederateCount);
    CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
    operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *)
               0x1f2c58);
    local_140 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ms
                               ((TimeRepresentation<count_time<9,_long>_> *)
                                in_stack_fffffffffffff848);
    iVar7 = (int)local_140;
    timeOut.__r._7_1_ = in_stack_fffffffffffff857;
    timeOut.__r._0_7_ = in_stack_fffffffffffff850;
    CommsInterface::setTimeout(in_stack_fffffffffffff848,timeOut);
    pCVar5 = CLI::std::
             unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
             operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                         *)0x1f2cb6);
    uVar3 = CommsInterface::connect(pCVar5,iVar7,__addr,sVar6);
    if ((uVar3 & 1) == 0) {
      local_1 = 0;
      local_144 = 1;
      goto LAB_001f3ae6;
    }
    CoreBroker::getIdentifier_abi_cxx11_(in_RDI);
    local_158 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    name._M_str = (char *)in_stack_fffffffffffff890;
    name._M_len = (size_t)in_stack_fffffffffffff888;
    BrokerFactory::addAssociatedBrokerType
              (name,(CoreType)((ulong)in_stack_fffffffffffff880.__r >> 0x20));
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f2daa);
  local_159 = (bVar1 ^ 0xffU) & 1;
  if (local_159 != 0) {
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f2dd8);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f2ded);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
               (allocator<char> *)in_stack_fffffffffffff880.__r);
    CLI::App::get_option(in_stack_fffffffffffff8c0,(string *)in_stack_fffffffffffff8b8);
    CLI::App::remove_option
              (in_stack_fffffffffffff8b8,
               (Option *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    std::allocator<char>::~allocator(local_181);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f2e8d);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f2ea2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
               (allocator<char> *)in_stack_fffffffffffff880.__r);
    CLI::App::get_option(in_stack_fffffffffffff8c0,(string *)in_stack_fffffffffffff8b8);
    CLI::App::remove_option
              (in_stack_fffffffffffff8b8,
               (Option *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    std::allocator<char>::~allocator(local_1a9);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f2f42);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f2f57);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
               (allocator<char> *)in_stack_fffffffffffff880.__r);
    CLI::App::get_option(in_stack_fffffffffffff8c0,(string *)in_stack_fffffffffffff8b8);
    CLI::App::remove_option
              (in_stack_fffffffffffff8b8,
               (Option *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    std::allocator<char>::~allocator(local_1d1);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f2ff7);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f300c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
               (allocator<char> *)in_stack_fffffffffffff880.__r);
    CLI::App::get_option(in_stack_fffffffffffff8c0,(string *)in_stack_fffffffffffff8b8);
    CLI::App::remove_option
              (in_stack_fffffffffffff8b8,
               (Option *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    std::allocator<char>::~allocator(local_1f9);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f30ac);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f30c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
               (allocator<char> *)in_stack_fffffffffffff880.__r);
    CLI::App::get_option(in_stack_fffffffffffff8c0,(string *)in_stack_fffffffffffff8b8);
    CLI::App::remove_option
              (in_stack_fffffffffffff8b8,
               (Option *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    std::allocator<char>::~allocator(local_221);
  }
  local_224 = 0;
  while ((local_159 & 1) != 0) {
    local_238 = 0;
    uStack_230 = 0;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = 0;
    uStack_250 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_288 = 0;
    uStack_280 = 0;
    local_298 = 0;
    uStack_290 = 0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_2b8 = 0;
    uStack_2b0 = 0;
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_2d8 = 0;
    uStack_2d0 = 0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_308 = 0;
    uStack_300 = 0;
    local_318 = 0;
    uStack_310 = 0;
    NetworkBrokerData::NetworkBrokerData
              ((NetworkBrokerData *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    NetworkBrokerData::operator=
              ((NetworkBrokerData *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (NetworkBrokerData *)in_stack_fffffffffffff848);
    NetworkBrokerData::~NetworkBrokerData
              ((NetworkBrokerData *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f33a4);
    CLI::App::get_config_formatter_base((App *)in_stack_fffffffffffff848);
    CLI::std::__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f33c3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
               (allocator<char> *)in_stack_fffffffffffff880.__r);
    this_00 = CLI::ConfigBase::section
                        ((ConfigBase *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850)
                         ,(string *)in_stack_fffffffffffff848);
    CLI::ConfigBase::index(this_00,(char *)(ulong)(uint)(int)local_224,__c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    std::allocator<char>::~allocator(local_349);
    CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x1f3455);
    peVar4 = CLI::std::
             __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f3462);
    helicsCLI11App::setDefaultCoreType(peVar4,MULTI);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f347e);
    std::__cxx11::string::string
              (in_stack_fffffffffffff890,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff888);
    CLI::App::parse(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                    (bool)in_stack_fffffffffffffad7);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
    peVar4 = CLI::std::
             __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f34ca);
    CVar2 = helicsCLI11App::getCoreType(peVar4);
    *(CoreType *)
     ((long)&in_RDI[1].super_BrokerBase.actionQueue.m_pullLock.super___mutex_base._M_mutex + 0x1c) =
         CVar2;
    if (*(int *)((long)&in_RDI[1].super_BrokerBase.actionQueue.m_pullLock.super___mutex_base.
                        _M_mutex + 0x1c) == 0x2d) {
      local_159 = 0;
    }
    else {
      CommFactory::create(in_stack_fffffffffffff85c);
      pCVar5 = CLI::std::
               unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
               operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                           *)0x1f3521);
      sVar6 = (socklen_t)pCVar5;
      std::function<void(helics::ActionMessage&&)>::
      function<helics::MultiBroker::brokerConnect()::__1,void>
                ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffff860,
                 (anon_class_16_2_f7f469bf *)
                 CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      CommsInterface::setCallback
                (in_stack_fffffffffffff860,
                 (function<void_(helics::ActionMessage_&&)> *)
                 CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      CLI::std::function<void_(helics::ActionMessage_&&)>::~function
                ((function<void_(helics::ActionMessage_&&)> *)0x1f3581);
      CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
      operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *
                 )0x1f358e);
      BrokerBase::getLoggingCallback
                ((BrokerBase *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      CommsInterface::setLoggingCallback
                (in_stack_fffffffffffff860,
                 (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      CLI::std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)0x1f35cf);
      in_stack_fffffffffffff888 =
           CLI::std::
           unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
           operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                       *)0x1f35dc);
      in_stack_fffffffffffff890 = CoreBroker::getIdentifier_abi_cxx11_(in_RDI);
      CommsInterface::setName
                ((CommsInterface *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                 (string *)in_stack_fffffffffffff848);
      pCVar5 = CLI::std::
               unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
               operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                           *)0x1f3613);
      (*pCVar5->_vptr_CommsInterface[2])(pCVar5,&in_RDI[1].super_BrokerBase.maxFederateCount);
      CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
      operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *
                 )0x1f363d);
      in_stack_fffffffffffff880 =
           TimeRepresentation<count_time<9,_long>_>::to_ms
                     ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffff848);
      iVar7 = (int)in_stack_fffffffffffff880.__r;
      timeOut_00.__r._7_1_ = in_stack_fffffffffffff857;
      timeOut_00.__r._0_7_ = in_stack_fffffffffffff850;
      CommsInterface::setTimeout(in_stack_fffffffffffff848,timeOut_00);
      pCVar5 = CLI::std::
               unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
               operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                           *)0x1f3688);
      uVar3 = CommsInterface::connect(pCVar5,iVar7,__addr_00,sVar6);
      CLI::std::
      vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
      ::push_back((vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                  (value_type *)in_stack_fffffffffffff848);
      bVar1 = (uVar3 & 1) != 0;
      if (bVar1) {
        CoreBroker::getIdentifier_abi_cxx11_(in_RDI);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
        name_00._M_str = (char *)in_stack_fffffffffffff890;
        name_00._M_len = (size_t)in_stack_fffffffffffff888;
        BrokerFactory::addAssociatedBrokerType
                  (name_00,(CoreType)((ulong)in_stack_fffffffffffff880.__r >> 0x20));
      }
      else {
        (*(in_RDI->super_Broker)._vptr_Broker[0x21])();
        local_1 = 0;
      }
      local_144 = (uint)!bVar1;
      CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
      ~unique_ptr((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                   *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
      if (local_144 != 0) goto LAB_001f3ae6;
    }
    local_224 = local_224 + 1;
  }
  local_1 = 1;
  local_144 = 1;
LAB_001f3ae6:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
  CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
            ((shared_ptr<helics::helicsCLI11App> *)0x1f3b00);
  return (bool)(local_1 & 1);
}

Assistant:

bool MultiBroker::brokerConnect()
{
    std::shared_ptr<helicsCLI11App> app;
    const std::string localConfigString = "--config='" + configFile + '\'';
    if (!configFile.empty()) {
        app = netInfo.commandLineParser("");
        app->addTypeOption();
        app->allow_config_extras(CLI::config_extras_mode::error);
    } else if (type == CoreType::MULTI) {
        type = CoreType::DEFAULT;
    }
    try {
        if (type == CoreType::MULTI) {
            app->get_config_formatter_base()->section("master");
            app->setDefaultCoreType(type);
            app->parse(localConfigString);
            type = app->getCoreType();
        }
        if (type != CoreType::MULTI) {
            if ((netInfo.brokerName.empty()) && (netInfo.brokerAddress.empty())) {
                CoreBroker::setAsRoot();
            }
            masterComm = CommFactory::create(type);
            masterComm->setCallback([this](ActionMessage&& message) {
                BrokerBase::addActionMessage(std::move(message));
            });
            masterComm->setLoggingCallback(BrokerBase::getLoggingCallback());
            masterComm->setName(getIdentifier());
            masterComm->loadNetworkInfo(netInfo);
            masterComm->setTimeout(networkTimeout.to_ms());

            if (!masterComm->connect()) {
                return false;
            }
            BrokerFactory::addAssociatedBrokerType(getIdentifier(), type);
        }
        bool moreComms = (!configFile.empty());
        if (moreComms) {
            // remove options that are used to specify a broker
            app->remove_option(app->get_option("--broker"));
            app->remove_option(app->get_option("--brokerport"));
            app->remove_option(app->get_option("--brokername"));
            app->remove_option(app->get_option("--brokeraddress"));
            app->remove_option(app->get_option("--autobroker"));
        }
        uint16_t index = 0;
        while (moreComms) {
            netInfo = NetworkBrokerData();  // to reset the networkBrokerData
            app->get_config_formatter_base()->section("comms")->index(index);
            app->setDefaultCoreType(CoreType::MULTI);
            app->parse(localConfigString);
            type = app->getCoreType();
            if (type != CoreType::MULTI) {
                auto comm = CommFactory::create(type);
                comm->setCallback([this, index](ActionMessage&& message) {
                    if (message.action() == CMD_REG_BROKER) {
                        message.setExtraData(index + 1);
                    }
                    BrokerBase::addActionMessage(std::move(message));
                });
                comm->setLoggingCallback(BrokerBase::getLoggingCallback());
                comm->setName(getIdentifier());
                comm->loadNetworkInfo(netInfo);
                comm->setTimeout(networkTimeout.to_ms());

                const bool res = comm->connect();
                comms.push_back(std::move(comm));
                if (!res) {
                    brokerDisconnect();
                    return false;
                }
                BrokerFactory::addAssociatedBrokerType(getIdentifier(), type);
            } else {
                moreComms = false;
            }
            ++index;
        }
    }
    catch (const CLI::Error& e) {
        std::ostringstream oss;
        app->exit(e, oss, oss);
        sendToLogger(parent_broker_id, HELICS_LOG_LEVEL_ERROR, getIdentifier(), oss.str());
        brokerDisconnect();
        return false;
    }
    catch (...) {
        brokerDisconnect();
        return false;
    }
    return true;
}